

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
spdlog::sinks::daily_filename_calculator::calc_filename(filename_t *filename,tm *now_tm)

{
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 in_stack_00000070 [16];
  string_view in_stack_00000080;
  filename_t ext;
  filename_t basename;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  int local_1d8;
  int local_1d4;
  undefined8 local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  int *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1a0 [4];
  string local_160 [32];
  string local_140 [24];
  filename_t *in_stack_fffffffffffffed8;
  undefined1 local_108 [88];
  undefined8 local_b0;
  undefined1 *local_a8;
  string *local_90;
  long local_88;
  int *local_80;
  int *local_78;
  string *local_70;
  undefined8 local_68 [3];
  undefined8 *local_50;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined1 *local_8;
  
  __args = in_RDI;
  std::__cxx11::string::string(local_140);
  std::__cxx11::string::string(local_160);
  details::file_helper::split_by_extension(in_stack_fffffffffffffed8);
  __in = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&stack0xfffffffffffffe40;
  std::tie<std::__cxx11::string,std::__cxx11::string>(__args,in_stack_fffffffffffffe10);
  this = local_1a0;
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=(this,__in);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x144c05);
  ::fmt::v8::
  basic_format_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_const_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::basic_format_string<char[26],_0>
            ((basic_format_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_const_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)__args,(char (*) [26])this);
  local_1d4 = *(int *)(in_RDX + 0x14) + 0x76c;
  local_1d8 = *(int *)(in_RDX + 0x10) + 1;
  local_88 = in_RDX + 0xc;
  local_68[0] = local_1d0;
  local_70 = local_140;
  local_78 = &local_1d4;
  local_80 = &local_1d8;
  local_90 = local_160;
  local_50 = local_68;
  ::fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string,int,int,int,std::__cxx11::string>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_28 = &local_b0;
  local_30 = local_108;
  local_18 = 0xd111d;
  local_b0 = 0xd111d;
  local_20 = local_30;
  local_10 = local_28;
  local_8 = local_30;
  local_a8 = local_30;
  ::fmt::v8::vformat_abi_cxx11_(in_stack_00000080,(format_args)in_stack_00000070);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_140);
  return in_RDI;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, const tm &now_tm)
    {
        filename_t basename, ext;
        std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
        return fmt::format(
            SPDLOG_FILENAME_T("{}_{:04d}-{:02d}-{:02d}{}"), basename, now_tm.tm_year + 1900, now_tm.tm_mon + 1, now_tm.tm_mday, ext);
    }